

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcarith.c
# Opt level: O2

boolean encode_mcu_AC_first(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  short sVar1;
  int iVar2;
  jpeg_entropy_encoder *pjVar3;
  JBLOCKROW paJVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  int *piVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  _func_void_j_compress_ptr *p_Var13;
  int local_5c;
  
  pjVar3 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    uVar7 = *(uint *)&pjVar3[4].start_pass;
    if (uVar7 == 0) {
      emit_restart(cinfo,*(int *)((long)&pjVar3[4].start_pass + 4));
      uVar7 = cinfo->restart_interval;
      *(uint *)((long)&pjVar3[4].start_pass + 4) =
           *(int *)((long)&pjVar3[4].start_pass + 4) + 1U & 7;
    }
    *(uint *)&pjVar3[4].start_pass = uVar7 - 1;
  }
  paJVar4 = *MCU_data;
  iVar2 = cinfo->cur_comp_info[0]->ac_tbl_no;
  uVar7 = cinfo->Se;
  for (uVar8 = (ulong)uVar7; 0 < (int)uVar8; uVar8 = uVar8 - 1) {
    sVar1 = (*paJVar4)[jpeg_natural_order[uVar8]];
    uVar6 = (uint)sVar1;
    if (sVar1 < 0) {
      uVar6 = -uVar6;
    }
    if (uVar6 >> ((byte)cinfo->Al & 0x1f) != 0) goto LAB_00131b26;
  }
  uVar8 = (ulong)((int)uVar7 >> 0x1f & uVar7);
LAB_00131b26:
  iVar10 = cinfo->Ss;
LAB_00131b48:
  if ((int)uVar8 < iVar10) {
    if (iVar10 <= cinfo->Se) {
      arith_encode(cinfo,(uchar *)((&pjVar3[9].finish_pass)[iVar2] + (iVar10 * 3 + -3)),1);
    }
    return 1;
  }
  p_Var13 = (&pjVar3[9].finish_pass)[iVar2];
  lVar12 = (long)(iVar10 * 3 + -3);
  arith_encode(cinfo,(uchar *)(p_Var13 + lVar12),0);
  piVar9 = jpeg_natural_order + iVar10;
  p_Var13 = p_Var13 + lVar12 + 1;
  do {
    sVar1 = (*paJVar4)[*piVar9];
    uVar7 = (uint)sVar1;
    if (sVar1 < 0) {
      bVar5 = (byte)cinfo->Al & 0x1f;
      uVar6 = -uVar7 >> bVar5;
      if (-uVar7 >> bVar5 != 0) {
        local_5c = 1;
        goto LAB_00131be7;
      }
    }
    else {
      bVar5 = (byte)cinfo->Al & 0x1f;
      uVar6 = uVar7 >> bVar5;
      if (uVar7 >> bVar5 != 0) break;
    }
    arith_encode(cinfo,(uchar *)p_Var13,0);
    iVar10 = iVar10 + 1;
    piVar9 = piVar9 + 1;
    p_Var13 = p_Var13 + 3;
  } while( true );
  local_5c = 0;
LAB_00131be7:
  uVar7 = 1;
  arith_encode(cinfo,(uchar *)p_Var13,1);
  arith_encode(cinfo,(uchar *)(pjVar3 + 0xf),local_5c);
  p_Var13 = p_Var13 + 1;
  uVar6 = uVar6 - 1;
  if (uVar6 == 0) {
    uVar7 = 0;
  }
  else {
    arith_encode(cinfo,(uchar *)p_Var13,1);
    if (uVar6 != 1) {
      arith_encode(cinfo,(uchar *)p_Var13,1);
      lVar12 = 0xbd;
      if ((int)(uint)cinfo->arith_ac_K[iVar2] < iVar10) {
        lVar12 = 0xd9;
      }
      p_Var13 = (&pjVar3[9].finish_pass)[iVar2] + lVar12;
      uVar7 = 2;
      for (uVar11 = uVar6; 3 < uVar11; uVar11 = uVar11 >> 1) {
        arith_encode(cinfo,(uchar *)p_Var13,1);
        uVar7 = uVar7 * 2;
        p_Var13 = p_Var13 + 1;
      }
    }
  }
  arith_encode(cinfo,(uchar *)p_Var13,0);
  while (1 < uVar7) {
    uVar7 = (int)uVar7 >> 1;
    arith_encode(cinfo,(uchar *)(p_Var13 + 0xe),(uint)((uVar7 & uVar6) != 0));
  }
  iVar10 = iVar10 + 1;
  goto LAB_00131b48;
}

Assistant:

METHODDEF(boolean)
encode_mcu_AC_first(j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr)cinfo->entropy;
  JBLOCKROW block;
  unsigned char *st;
  int tbl, k, ke;
  int v, v2, m;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      emit_restart(cinfo, entropy->next_restart_num);
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  /* Encode the MCU data block */
  block = MCU_data[0];
  tbl = cinfo->cur_comp_info[0]->ac_tbl_no;

  /* Sections F.1.4.2 & F.1.4.4.2: Encoding of AC coefficients */

  /* Establish EOB (end-of-block) index */
  for (ke = cinfo->Se; ke > 0; ke--)
    /* We must apply the point transform by Al.  For AC coefficients this
     * is an integer division with rounding towards 0.  To do this portably
     * in C, we shift after obtaining the absolute value.
     */
    if ((v = (*block)[jpeg_natural_order[ke]]) >= 0) {
      if (v >>= cinfo->Al) break;
    } else {
      v = -v;
      if (v >>= cinfo->Al) break;
    }

  /* Figure F.5: Encode_AC_Coefficients */
  for (k = cinfo->Ss; k <= ke; k++) {
    st = entropy->ac_stats[tbl] + 3 * (k - 1);
    arith_encode(cinfo, st, 0);         /* EOB decision */
    for (;;) {
      if ((v = (*block)[jpeg_natural_order[k]]) >= 0) {
        if (v >>= cinfo->Al) {
          arith_encode(cinfo, st + 1, 1);
          arith_encode(cinfo, entropy->fixed_bin, 0);
          break;
        }
      } else {
        v = -v;
        if (v >>= cinfo->Al) {
          arith_encode(cinfo, st + 1, 1);
          arith_encode(cinfo, entropy->fixed_bin, 1);
          break;
        }
      }
      arith_encode(cinfo, st + 1, 0);  st += 3;  k++;
    }
    st += 2;
    /* Figure F.8: Encoding the magnitude category of v */
    m = 0;
    if (v -= 1) {
      arith_encode(cinfo, st, 1);
      m = 1;
      v2 = v;
      if (v2 >>= 1) {
        arith_encode(cinfo, st, 1);
        m <<= 1;
        st = entropy->ac_stats[tbl] +
             (k <= cinfo->arith_ac_K[tbl] ? 189 : 217);
        while (v2 >>= 1) {
          arith_encode(cinfo, st, 1);
          m <<= 1;
          st += 1;
        }
      }
    }
    arith_encode(cinfo, st, 0);
    /* Figure F.9: Encoding the magnitude bit pattern of v */
    st += 14;
    while (m >>= 1)
      arith_encode(cinfo, st, (m & v) ? 1 : 0);
  }
  /* Encode EOB decision only if k <= cinfo->Se */
  if (k <= cinfo->Se) {
    st = entropy->ac_stats[tbl] + 3 * (k - 1);
    arith_encode(cinfo, st, 1);
  }

  return TRUE;
}